

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void TableSettingsHandler_ClearAll(ImGuiContext *ctx,ImGuiSettingsHandler *param_2)

{
  ImGuiTable *pIVar1;
  int i;
  int n;
  
  for (n = 0; n != (ctx->Tables).Map.Data.Size; n = n + 1) {
    pIVar1 = ImPool<ImGuiTable>::TryGetMapData(&ctx->Tables,n);
    if (pIVar1 != (ImGuiTable *)0x0) {
      pIVar1->SettingsOffset = -1;
    }
  }
  ImVector<char>::clear(&(ctx->SettingsTables).Buf);
  return;
}

Assistant:

static void TableSettingsHandler_ClearAll(ImGuiContext* ctx, ImGuiSettingsHandler*)
{
    ImGuiContext& g = *ctx;
    for (int i = 0; i != g.Tables.GetMapSize(); i++)
        if (ImGuiTable* table = g.Tables.TryGetMapData(i))
            table->SettingsOffset = -1;
    g.SettingsTables.clear();
}